

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjWeakRefLookupTable::remove_stale_weak_refs(CVmObjWeakRefLookupTable *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  bool bVar10;
  
  iVar2 = CVmObjTable::is_obj_deletable
                    (&G_obj_table_X,
                     (vm_val_t *)
                     ((this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_ +
                     0x10));
  if (iVar2 != 0) {
    pcVar1 = (this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_;
    pcVar1[0x10] = '\x01';
    pcVar1[0x11] = '\0';
    pcVar1[0x12] = '\0';
    pcVar1[0x13] = '\0';
  }
  piVar4 = (int *)(this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_;
  iVar2 = *piVar4;
  piVar4 = piVar4 + 8;
  lVar6 = 0;
LAB_0025f98c:
  bVar10 = iVar2 == 0;
  iVar2 = iVar2 + -1;
  if (bVar10) {
    return;
  }
  puVar7 = *(undefined4 **)piVar4;
  puVar8 = (undefined4 *)0x0;
  do {
    puVar9 = puVar8;
    puVar8 = puVar7;
    while( true ) {
      if (puVar8 == (undefined4 *)0x0) {
        piVar4 = piVar4 + 2;
        lVar6 = lVar6 + 1;
        goto LAB_0025f98c;
      }
      puVar7 = *(undefined4 **)(puVar8 + 8);
      iVar3 = CVmObjTable::is_obj_deletable(&G_obj_table_X,(vm_val_t *)(puVar8 + 4));
      if (iVar3 == 0) break;
      pcVar1 = (this->super_CVmObjLookupTable).super_CVmObjCollection.super_CVmObject.ext_;
      pcVar5 = pcVar1 + lVar6 * 8 + 0x20;
      if (puVar9 != (undefined4 *)0x0) {
        pcVar5 = (char *)(puVar9 + 8);
      }
      *(undefined8 *)pcVar5 = *(undefined8 *)(puVar8 + 8);
      *(undefined8 *)(puVar8 + 8) = *(undefined8 *)(pcVar1 + 8);
      *(undefined4 **)(pcVar1 + 8) = puVar8;
      *puVar8 = 0xd;
      puVar8[4] = 0xd;
      puVar8 = puVar7;
    }
  } while( true );
}

Assistant:

void CVmObjWeakRefLookupTable::remove_stale_weak_refs(VMG0_)
{
    vm_lookup_val **bucket;
    uint i;
    uint hashval;

    /* remove the default value if it's gone stale */
    if (G_obj_table->is_obj_deletable(&get_ext()->default_value))
        get_ext()->default_value.set_nil();

    /* run through each bucket */
    for (hashval = 0, bucket = get_ext()->buckets, i = get_bucket_count() ;
         i != 0 ; ++bucket, --i, ++hashval)
    {
        vm_lookup_val *entry;
        vm_lookup_val *prv;
        vm_lookup_val *nxt;

        /* run through all entries attached to this bucket */
        for (prv = 0, entry = *bucket ; entry != 0 ; entry = nxt)
        {
            /* remember the next entry, in case we delete this one */
            nxt = entry->nxt;

            /* 
             *   if the value has an object reference that has become stale,
             *   delete the entry 
             */
            if (G_obj_table->is_obj_deletable(&entry->val))
            {
                /* it's deletable, so delete the entire record */
                unlink_entry(vmg_ entry, hashval, prv);

                /* 
                 *   note that we do NOT advance the prv pointer - we've
                 *   deleted this entry, so the one preceding it is now the
                 *   previous for the one following this one 
                 */
            }
            else
            {
                /* we're keeping this entry - make it the new previous */
                prv = entry;
            }
        }
    }
}